

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O0

void __thiscall diy::AMRLink::save(AMRLink *this,BinaryBuffer *bb)

{
  Link *in_RSI;
  Description *in_RDI;
  
  Link::save(in_RSI,(BinaryBuffer *)in_RDI);
  save<int>((BinaryBuffer *)in_RSI,&in_RDI->level);
  save<diy::AMRLink::Description>((BinaryBuffer *)in_RSI,in_RDI);
  save<std::vector<diy::AMRLink::Description,std::allocator<diy::AMRLink::Description>>>
            ((BinaryBuffer *)in_RSI,
             (vector<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_> *)in_RDI
            );
  save<std::vector<diy::Direction,std::allocator<diy::Direction>>>
            ((BinaryBuffer *)in_RSI,
             (vector<diy::Direction,_std::allocator<diy::Direction>_> *)in_RDI);
  return;
}

Assistant:

void          save(BinaryBuffer& bb) const override
      {
          Link::save(bb);
          diy::save(bb, dim_);
          diy::save(bb, local_);
          diy::save(bb, nbr_descriptions_);
          diy::save(bb, wrap_);
      }